

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_tuple_primitive_setIdentityHash
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  uVar1 = *arguments;
  if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
    sysbvm_error("Cannot set the identity hash of an immediate value.");
  }
  uVar2 = arguments[1];
  if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
    iVar3 = (int)((long)uVar2 >> 4);
  }
  else {
    iVar3 = (int)*(undefined8 *)(uVar2 + 0x10);
  }
  *(uint *)(uVar1 + 8) = iVar3 << 10 | *(uint *)(uVar1 + 8) & 0x3ff;
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_setIdentityHash(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[0])) sysbvm_error("Cannot set the identity hash of an immediate value.");

    sysbvm_tuple_setIdentityHash((sysbvm_object_tuple_t*)arguments[0], sysbvm_tuple_size_decode(arguments[1]));
    return SYSBVM_VOID_TUPLE;
}